

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O2

packer<msgpack::v1::sbuffer> * __thiscall
msgpack::v1::adaptor::pack<std::tuple<int&&,char_const*&&>,void>::operator()
          (void *this,packer<msgpack::v1::sbuffer> *o,tuple<int_&&,_const_char_*&&> *v)

{
  packer<msgpack::v1::sbuffer>::pack_array(o,2);
  StdTuplePacker<msgpack::v1::sbuffer,_const_std::tuple<int_&&,_const_char_*&&>_&,_2UL>::pack(o,v);
  return o;
}

Assistant:

msgpack::packer<Stream>& operator()(
        msgpack::packer<Stream>& o,
        const std::tuple<Args...>& v) const {
        uint32_t size = checked_get_container_size(sizeof...(Args));
        o.pack_array(size);
        StdTuplePacker<Stream, decltype(v), sizeof...(Args)>::pack(o, v);
        return o;
    }